

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O2

double inform_shannon_cross(inform_dist *p,inform_dist *q,double base)

{
  uint64_t uVar1;
  uint uVar2;
  _Bool _Var3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  _Var3 = inform_dist_is_valid(p);
  dVar6 = NAN;
  if (_Var3) {
    _Var3 = inform_dist_is_valid(q);
    if (_Var3) {
      uVar4 = p->size;
      dVar6 = NAN;
      if (uVar4 == q->size) {
        dVar6 = 0.0;
        for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
          uVar2 = p->histogram[uVar5];
          if (uVar2 != 0 || q->histogram[uVar5] != 0) {
            uVar1 = p->counts;
            dVar7 = log2((double)q->histogram[uVar5] /
                         (((double)CONCAT44(0x45300000,(int)(q->counts >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)q->counts) - 4503599627370496.0)));
            dVar6 = dVar6 - dVar7 * ((double)uVar2 /
                                    (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)))
            ;
            uVar4 = p->size;
          }
        }
        dVar7 = log2(base);
        dVar6 = dVar6 / dVar7;
      }
    }
    else {
      dVar6 = NAN;
    }
  }
  return dVar6;
}

Assistant:

double inform_shannon_cross(inform_dist const *p, inform_dist const *q,
    double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double ce = 0.;
        for (size_t i = 0; i < p->size; ++i)
        {
            if (p->histogram[i] != 0 || q->histogram[i] != 0)
            {
                double u = (double) p->histogram[i] / p->counts;
                double v = (double) q->histogram[i] / q->counts;
                ce -= u * log2(v);
            }
        }
        return ce / log2(base);
    }
    return NAN;
}